

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluVerify(word *pF,int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  int iVar1;
  int iStack_1003c;
  int i;
  word pTTRes [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word *pFStruth_local;
  word BStruth_local;
  If_Grp_t *r_local;
  If_Grp_t *g_local;
  word *pwStack_10;
  int nVars_local;
  word *pF_local;
  
  pFStruth_local = (word *)BStruth;
  BStruth_local = (word)r;
  r_local = g;
  g_local._4_4_ = nVars;
  pwStack_10 = pF;
  if ((g->nVars < '\a') && (r->nVars < '\a')) {
    if (TruthAll[0][0] == 0) {
      If_CluInitTruthTables();
    }
    for (iStack_1003c = 0; iStack_1003c < r_local->nVars; iStack_1003c = iStack_1003c + 1) {
      If_CluCopy(pTTFans[(long)iStack_1003c + -1] + 0x3ff,
                 TruthAll[(int)r_local->pVars[iStack_1003c]],g_local._4_4_);
    }
    If_CluComposeLut(g_local._4_4_,r_local,(word *)&pFStruth_local,
                     (word (*) [1024])(pTTWire + 0x3ff),pTTRes + 0x3ff);
    for (iStack_1003c = 0; iStack_1003c < *(char *)BStruth_local; iStack_1003c = iStack_1003c + 1) {
      if (*(char *)(BStruth_local + 2 + (long)iStack_1003c) == g_local._4_4_) {
        If_CluCopy(pTTFans[(long)iStack_1003c + -1] + 0x3ff,pTTRes + 0x3ff,g_local._4_4_);
      }
      else {
        If_CluCopy(pTTFans[(long)iStack_1003c + -1] + 0x3ff,
                   TruthAll[(int)*(char *)(BStruth_local + 2 + (long)iStack_1003c)],g_local._4_4_);
      }
    }
    If_CluComposeLut(g_local._4_4_,(If_Grp_t *)BStruth_local,pFStruth,
                     (word (*) [1024])(pTTWire + 0x3ff),(word *)&stack0xfffffffffffeffc8);
    iVar1 = If_CluEqual((word *)&stack0xfffffffffffeffc8,pwStack_10,g_local._4_4_);
    if (iVar1 == 0) {
      printf("\n");
      If_CluPrintConfig(g_local._4_4_,r_local,(If_Grp_t *)BStruth_local,(word)pFStruth_local,
                        pFStruth);
      Kit_DsdPrintFromTruth((uint *)&stack0xfffffffffffeffc8,g_local._4_4_);
      printf("\n");
      Kit_DsdPrintFromTruth((uint *)pwStack_10,g_local._4_4_);
      printf("\n");
      printf("Verification FAILED!\n");
    }
    return;
  }
  __assert_fail("g->nVars <= 6 && r->nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x285,"void If_CluVerify(word *, int, If_Grp_t *, If_Grp_t *, word, word *)");
}

Assistant:

void If_CluVerify( word * pF, int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, pFStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "\n" );
        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}